

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O0

char * NewtBaseName(char *s,uint32_t len)

{
  char cVar1;
  uint local_24;
  uint uStack_20;
  char sep;
  uint32_t i;
  uint32_t base;
  uint32_t len_local;
  char *s_local;
  
  uStack_20 = 0;
  cVar1 = NewtGetFileSeparator();
  for (local_24 = 0; local_24 < len; local_24 = local_24 + 1) {
    if (s[local_24] == cVar1) {
      uStack_20 = local_24 + 1;
    }
  }
  if (uStack_20 < len) {
    s_local = s + uStack_20;
  }
  else {
    s_local = (char *)0x0;
  }
  return s_local;
}

Assistant:

char * NewtBaseName(char * s, uint32_t len)
{
    uint32_t	base = 0;
    uint32_t	i;
    char		sep;
    
    sep = NewtGetFileSeparator();
    
    for (i = 0; i < len; i++)
    {
        if (s[i] == sep)
            base = i + 1;
    }
    
    if (base < len)
        return (s + base);
    else
        return NULL;
}